

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O3

void __thiscall sighash_tests::sighash_test::test_method(sighash_test *this)

{
  FastRandomContext *this_00;
  undefined8 *puVar1;
  pointer pCVar2;
  size_type new_capacity;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  undefined1 auVar9 [8];
  undefined7 uVar10;
  undefined1 *puVar11;
  uint uVar12;
  iterator pvVar13;
  uint64_t uVar14;
  uint32_t *puVar15;
  uint uVar16;
  ulong uVar17;
  assertion_result *paVar18;
  int iVar19;
  ulong uVar20;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_01;
  ulong uVar21;
  pointer pCVar22;
  long lVar23;
  long in_FS_OFFSET;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  const_string file;
  const_string msg;
  check_type cVar27;
  char local_298;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  CMutableTransaction txTo;
  CMutableTransaction txTmp;
  ParamsStream<HashWriter_&,_TransactionSerParams> local_1d8;
  undefined1 local_1c8 [8];
  bool bStack_1c0;
  undefined7 uStack_1bf;
  undefined1 *local_1b8;
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_1b0 [4];
  direct_or_indirect local_148;
  uint local_12c;
  uint256 local_128;
  uint256 sho;
  uint256 sh;
  undefined1 local_c8 [28];
  uint uStack_ac;
  undefined1 local_a8 [28];
  uint uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  long local_38;
  uint nHashType;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  iVar19 = 0;
  do {
    pvVar13 = (iterator)
              RandomMixin<FastRandomContext>::randbits<32>
                        (&this_00->super_RandomMixin<FastRandomContext>);
    CMutableTransaction::CMutableTransaction(&txTo);
    nHashType = (uint)pvVar13;
    uVar16 = nHashType & 0x1f;
    SigHashTest::RandomTransaction(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&txTo,uVar16 == 3);
    stack0xffffffffffffff48 = (undefined1  [16])0x0;
    local_c8._0_16_ = (undefined1  [16])0x0;
    SigHashTest::RandomScript(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(CScript *)local_c8);
    uVar21 = ((long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 - 1;
    if (uVar21 == 0) {
      uVar12 = 0x40;
    }
    else {
      lVar23 = 0x3f;
      if (uVar21 != 0) {
        for (; uVar21 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      uVar12 = (uint)lVar23 ^ 0x3f;
    }
    do {
      uVar14 = RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar12);
    } while (uVar21 < uVar14);
    sho.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8);
    CTransaction::CTransaction((CTransaction *)local_1c8,&txTo);
    uVar12 = (uint)uVar14;
    uVar20 = uVar14 & 0xffffffff;
    uVar21 = (CONCAT71(uStack_1bf,bStack_1c0) - (long)local_1c8 >> 3) * 0x4ec4ec4ec4ec4ec5;
    if (uVar21 < uVar20 || uVar21 - uVar20 == 0) {
      local_128.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
      local_128.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    }
    else {
      CMutableTransaction::CMutableTransaction(&txTmp,(CTransaction *)local_1c8);
      CScript::CScript((CScript *)local_a8,OP_CODESEPARATOR);
      FindAndDelete((CScript *)&local_148.indirect_contents,(CScript *)local_a8);
      if (0x1c < uStack_8c) {
        free((void *)CONCAT71(local_a8._1_7_,local_a8[0]));
      }
      if (txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar21 = 0;
        uVar17 = 1;
        do {
          pCVar2 = txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pCVar6 = txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar21;
          if (0x1c < txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21].scriptSig.super_CScriptBase._size) {
            free((pCVar6->scriptSig).super_CScriptBase._union.indirect_contents.indirect);
          }
          *(undefined1 (*) [16])((long)&pCVar2[uVar21].scriptSig.super_CScriptBase._union + 0x10) =
               (undefined1  [16])0x0;
          *(undefined1 (*) [16])&(pCVar6->scriptSig).super_CScriptBase._union =
               (undefined1  [16])0x0;
          uVar21 = ((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          bVar24 = uVar17 <= uVar21;
          lVar23 = uVar21 - uVar17;
          uVar21 = uVar17;
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (bVar24 && lVar23 != 0);
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20].scriptSig.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents);
      pCVar8 = txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pCVar7 = txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar16 == 3) {
        uVar21 = ((long)txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        if (uVar20 <= uVar21 && uVar21 - uVar20 != 0) {
          std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txTmp.vout,(ulong)(uVar12 + 1));
          if (uVar12 != 0) {
            lVar23 = 0;
            do {
              pCVar7 = txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)
                       ((long)&(txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                _M_impl.super__Vector_impl_data._M_start)->nValue + lVar23);
              this_01 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar1 + 1);
              *puVar1 = 0xffffffffffffffff;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(this_01,0);
              uVar16 = *(uint *)((long)&(pCVar7->scriptPubKey).super_CScriptBase._size + lVar23);
              new_capacity = uVar16 - 0x1d;
              if (uVar16 < 0x1d) {
                new_capacity = uVar16;
              }
              prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
                        (this_01,new_capacity);
              lVar23 = lVar23 + 0x28;
            } while (uVar20 * 0x28 != lVar23);
          }
          if ((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar21 = ((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
            puVar15 = &(txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->nSequence;
            uVar16 = 1;
            do {
              if (uVar16 - uVar12 != 1) {
                *puVar15 = 0;
              }
              uVar17 = (ulong)uVar16;
              puVar15 = puVar15 + 0x1a;
              uVar16 = uVar16 + 1;
            } while (uVar17 <= uVar21 && uVar21 - uVar17 != 0);
          }
          goto LAB_006265ef;
        }
        local_128.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        local_128.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      }
      else {
        if (uVar16 == 2) {
          pCVar22 = txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start) {
            do {
              if (0x1c < (pCVar22->scriptPubKey).super_CScriptBase._size) {
                free((pCVar22->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect);
                (pCVar22->scriptPubKey).super_CScriptBase._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              pCVar22 = pCVar22 + 1;
            } while (pCVar22 != pCVar8);
            txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish = pCVar7;
          }
          if ((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar21 = ((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
            puVar15 = &(txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->nSequence;
            uVar16 = 1;
            do {
              if (uVar16 - uVar12 != 1) {
                *puVar15 = 0;
              }
              uVar17 = (ulong)uVar16;
              puVar15 = puVar15 + 0x1a;
              uVar16 = uVar16 + 1;
            } while (uVar17 <= uVar21 && uVar21 - uVar17 != 0);
          }
        }
LAB_006265ef:
        pCVar6 = txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_298 = (char)pvVar13;
        if (local_298 < '\0') {
          pCVar2 = txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar20;
          ((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start)->prevout).n = (pCVar2->prevout).n;
          uVar3 = *(undefined8 *)
                   (pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar4 = *(undefined8 *)
                   ((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar5 = *(undefined8 *)
                   ((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          *(undefined8 *)
           (((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems + 0x10) =
               *(undefined8 *)
                ((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          *(undefined8 *)
           (((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems + 0x18) = uVar5;
          *(undefined8 *)
           ((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data
           ._M_elems = uVar3;
          *(undefined8 *)
           (((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
            m_data._M_elems + 8) = uVar4;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&((txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,
                     &(pCVar2->scriptSig).super_CScriptBase);
          pCVar6->nSequence = pCVar6[uVar20].nSequence;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator=(&(pCVar6->scriptWitness).stack,&pCVar6[uVar20].scriptWitness.stack);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txTmp.vin,1);
        }
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_a8._16_8_ = 0;
        local_a8._24_4_ = 0;
        uStack_8c = 0;
        local_a8[0] = '\0';
        local_a8._1_7_ = 0;
        local_a8._8_8_ = 0;
        local_48 = 0;
        CSHA256::CSHA256((CSHA256 *)local_a8);
        local_1d8.m_params = &::TX_NO_WITNESS;
        local_1d8.m_substream = (HashWriter *)local_a8;
        SerializeTransaction<ParamsStream<HashWriter&,TransactionSerParams>,CMutableTransaction>
                  (&txTmp,&local_1d8,&::TX_NO_WITNESS);
        local_1d8.m_params = (TransactionSerParams *)CONCAT44(local_1d8.m_params._4_4_,nHashType);
        CSHA256::Write((CSHA256 *)local_a8,(uchar *)&local_1d8,4);
        HashWriter::GetHash(&local_128,(HashWriter *)local_a8);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txTmp.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txTmp.vin);
    }
    sho.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x18];
    sho.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x19];
    sho.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1a];
    sho.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1b];
    sho.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1c];
    sho.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1d];
    sho.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1e];
    sho.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1f];
    sho.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x10];
    sho.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x11];
    sho.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x12];
    sho.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x13];
    sho.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x14];
    sho.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x15];
    sho.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x16];
    sho.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x17];
    sho.super_base_blob<256U>.m_data._M_elems[8] =
         local_128.super_base_blob<256U>.m_data._M_elems[8];
    sho.super_base_blob<256U>.m_data._M_elems[9] =
         local_128.super_base_blob<256U>.m_data._M_elems[9];
    sho.super_base_blob<256U>.m_data._M_elems[10] =
         local_128.super_base_blob<256U>.m_data._M_elems[10];
    sho.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xb];
    sho.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xc];
    sho.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xd];
    sho.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xe];
    sho.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xf];
    sho.super_base_blob<256U>.m_data._M_elems[0] =
         local_128.super_base_blob<256U>.m_data._M_elems[0];
    sho.super_base_blob<256U>.m_data._M_elems[1] =
         local_128.super_base_blob<256U>.m_data._M_elems[1];
    sho.super_base_blob<256U>.m_data._M_elems[2] =
         local_128.super_base_blob<256U>.m_data._M_elems[2];
    sho.super_base_blob<256U>.m_data._M_elems[3] =
         local_128.super_base_blob<256U>.m_data._M_elems[3];
    sho.super_base_blob<256U>.m_data._M_elems[4] =
         local_128.super_base_blob<256U>.m_data._M_elems[4];
    sho.super_base_blob<256U>.m_data._M_elems[5] =
         local_128.super_base_blob<256U>.m_data._M_elems[5];
    sho.super_base_blob<256U>.m_data._M_elems[6] =
         local_128.super_base_blob<256U>.m_data._M_elems[6];
    sho.super_base_blob<256U>.m_data._M_elems[7] =
         local_128.super_base_blob<256U>.m_data._M_elems[7];
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
    if (0x1c < local_12c) {
      free(local_148.indirect_contents.indirect);
      local_148.indirect_contents.indirect = (char *)0x0;
    }
    local_a8[0] = '\0';
    local_a8._1_7_ = 0;
    paVar18 = (assertion_result *)local_a8;
    SignatureHash<CMutableTransaction>
              ((uint256 *)local_1c8,(CScript *)local_c8,&txTo,uVar12,nHashType,(CAmount *)local_a8,
               BASE,(PrecomputedTransactionData *)0x0);
    pCVar7 = avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar11 = local_1b8;
    uVar10 = uStack_1bf;
    bVar24 = bStack_1c0;
    auVar9 = local_1c8;
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar27 = 0x62682e;
    file.m_end = (iterator)0x9c;
    file.m_begin = (iterator)&local_258;
    msg.m_end = (iterator)paVar18;
    msg.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
    sh.super_base_blob<256U>.m_data._M_elems[0] = auVar9[0];
    sh.super_base_blob<256U>.m_data._M_elems[1] = auVar9[1];
    sh.super_base_blob<256U>.m_data._M_elems[2] = auVar9[2];
    sh.super_base_blob<256U>.m_data._M_elems[3] = auVar9[3];
    sh.super_base_blob<256U>.m_data._M_elems[4] = auVar9[4];
    sh.super_base_blob<256U>.m_data._M_elems[5] = auVar9[5];
    sh.super_base_blob<256U>.m_data._M_elems[6] = auVar9[6];
    sh.super_base_blob<256U>.m_data._M_elems[7] = auVar9[7];
    sh.super_base_blob<256U>.m_data._M_elems[9] = (uchar)uVar10;
    sh.super_base_blob<256U>.m_data._M_elems[10] = SUB71(uVar10,1);
    sh.super_base_blob<256U>.m_data._M_elems[0xb] = SUB71(uVar10,2);
    sh.super_base_blob<256U>.m_data._M_elems[0xc] = SUB71(uVar10,3);
    sh.super_base_blob<256U>.m_data._M_elems[0xd] = SUB71(uVar10,4);
    sh.super_base_blob<256U>.m_data._M_elems[0xe] = SUB71(uVar10,5);
    sh.super_base_blob<256U>.m_data._M_elems[0xf] = SUB71(uVar10,6);
    sh.super_base_blob<256U>.m_data._M_elems[0x10] = (uchar)puVar11;
    sh.super_base_blob<256U>.m_data._M_elems[0x11] = (uchar)((ulong)puVar11 >> 8);
    sh.super_base_blob<256U>.m_data._M_elems[0x12] = (uchar)((ulong)puVar11 >> 0x10);
    sh.super_base_blob<256U>.m_data._M_elems[0x13] = (uchar)((ulong)puVar11 >> 0x18);
    sh.super_base_blob<256U>.m_data._M_elems[0x14] = (uchar)((ulong)puVar11 >> 0x20);
    sh.super_base_blob<256U>.m_data._M_elems[0x15] = (uchar)((ulong)puVar11 >> 0x28);
    sh.super_base_blob<256U>.m_data._M_elems[0x16] = (uchar)((ulong)puVar11 >> 0x30);
    sh.super_base_blob<256U>.m_data._M_elems[0x17] = (uchar)((ulong)puVar11 >> 0x38);
    sh.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)pCVar7;
    sh.super_base_blob<256U>.m_data._M_elems[0x19] = (uchar)((ulong)pCVar7 >> 8);
    sh.super_base_blob<256U>.m_data._M_elems[0x1a] = (uchar)((ulong)pCVar7 >> 0x10);
    sh.super_base_blob<256U>.m_data._M_elems[0x1b] = (uchar)((ulong)pCVar7 >> 0x18);
    sh.super_base_blob<256U>.m_data._M_elems[0x1c] = (uchar)((ulong)pCVar7 >> 0x20);
    sh.super_base_blob<256U>.m_data._M_elems[0x1d] = (uchar)((ulong)pCVar7 >> 0x28);
    sh.super_base_blob<256U>.m_data._M_elems[0x1e] = (uchar)((ulong)pCVar7 >> 0x30);
    sh.super_base_blob<256U>.m_data._M_elems[0x1f] = (uchar)((ulong)pCVar7 >> 0x38);
    auVar26[0] = -(sh.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar26[1] = -(sh.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar26[2] = -(sh.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar26[3] = -(sh.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar26[4] = -(sh.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar26[5] = -(sh.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar26[6] = -(sh.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar26[7] = -(sh.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar26[8] = -(sh.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar26[9] = -(sh.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar26[10] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   sho.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar26[0xb] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar26[0xc] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar26[0xd] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar26[0xe] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar26[0xf] = -(sh.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar25[0] = -(sh.super_base_blob<256U>.m_data._M_elems[0] ==
                  sho.super_base_blob<256U>.m_data._M_elems[0]);
    auVar25[1] = -(sh.super_base_blob<256U>.m_data._M_elems[1] ==
                  sho.super_base_blob<256U>.m_data._M_elems[1]);
    auVar25[2] = -(sh.super_base_blob<256U>.m_data._M_elems[2] ==
                  sho.super_base_blob<256U>.m_data._M_elems[2]);
    auVar25[3] = -(sh.super_base_blob<256U>.m_data._M_elems[3] ==
                  sho.super_base_blob<256U>.m_data._M_elems[3]);
    auVar25[4] = -(sh.super_base_blob<256U>.m_data._M_elems[4] ==
                  sho.super_base_blob<256U>.m_data._M_elems[4]);
    auVar25[5] = -(sh.super_base_blob<256U>.m_data._M_elems[5] ==
                  sho.super_base_blob<256U>.m_data._M_elems[5]);
    auVar25[6] = -(sh.super_base_blob<256U>.m_data._M_elems[6] ==
                  sho.super_base_blob<256U>.m_data._M_elems[6]);
    auVar25[7] = -(sh.super_base_blob<256U>.m_data._M_elems[7] ==
                  sho.super_base_blob<256U>.m_data._M_elems[7]);
    auVar25[8] = -(bVar24 == (bool)sho.super_base_blob<256U>.m_data._M_elems[8]);
    auVar25[9] = -(sh.super_base_blob<256U>.m_data._M_elems[9] ==
                  sho.super_base_blob<256U>.m_data._M_elems[9]);
    auVar25[10] = -(sh.super_base_blob<256U>.m_data._M_elems[10] ==
                   sho.super_base_blob<256U>.m_data._M_elems[10]);
    auVar25[0xb] = -(sh.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar25[0xc] = -(sh.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar25[0xd] = -(sh.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar25[0xe] = -(sh.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar25[0xf] = -(sh.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    sho.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar25 = auVar25 & auVar26;
    local_a8[0] = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_173ee8a;
    txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xf11209;
    bStack_1c0 = false;
    local_1c8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&txTmp;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
    ;
    local_270 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_a8,(lazy_ostream *)local_1c8,1,0,WARN,_cVar27,
               (size_t)&local_278,0x9c);
    boost::detail::shared_count::~shared_count((shared_count *)(local_a8 + 0x10));
    if (0x1c < uStack_ac) {
      free((void *)local_c8._0_8_);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txTo.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txTo.vin);
    iVar19 = iVar19 + 1;
    if (iVar19 == 50000) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(sighash_test)
{
    #if defined(PRINT_SIGHASH_JSON)
    std::cout << "[\n";
    std::cout << "\t[\"raw_transaction, script, input_index, hashType, signature_hash (result)\"],\n";
    int nRandomTests = 500;
    #else
    int nRandomTests = 50000;
    #endif
    for (int i=0; i<nRandomTests; i++) {
        int nHashType{int(m_rng.rand32())};
        CMutableTransaction txTo;
        RandomTransaction(txTo, (nHashType & 0x1f) == SIGHASH_SINGLE);
        CScript scriptCode;
        RandomScript(scriptCode);
        int nIn = m_rng.randrange(txTo.vin.size());

        uint256 sh, sho;
        sho = SignatureHashOld(scriptCode, CTransaction(txTo), nIn, nHashType);
        sh = SignatureHash(scriptCode, txTo, nIn, nHashType, 0, SigVersion::BASE);
        #if defined(PRINT_SIGHASH_JSON)
        DataStream ss;
        ss << TX_WITH_WITNESS(txTo);

        std::cout << "\t[\"" ;
        std::cout << HexStr(ss) << "\", \"";
        std::cout << HexStr(scriptCode) << "\", ";
        std::cout << nIn << ", ";
        std::cout << nHashType << ", \"";
        std::cout << sho.GetHex() << "\"]";
        if (i+1 != nRandomTests) {
          std::cout << ",";
        }
        std::cout << "\n";
        #endif
        BOOST_CHECK(sh == sho);
    }
    #if defined(PRINT_SIGHASH_JSON)
    std::cout << "]\n";
    #endif
}